

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_cbs_auth.c
# Opt level: O3

void * authentication_clone_option(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  
  if (name == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (void *)0x0;
    }
    pcVar3 = "Failed to clone authentication option (name is NULL)";
    iVar1 = 0x140;
  }
  else if (value == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (void *)0x0;
    }
    pcVar3 = "Failed to clone authentication option (value is NULL)";
    iVar1 = 0x145;
  }
  else {
    iVar1 = strcmp("cbs_request_timeout_secs",name);
    if (iVar1 == 0) {
      return value;
    }
    iVar1 = strcmp("saved_authentication_options",name);
    if (iVar1 == 0) {
      return value;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (void *)0x0;
    }
    pcVar3 = "Failed to clone authentication option (option with name \'%s\' is not suppported)";
    iVar1 = 0x151;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
            ,"authentication_clone_option",iVar1,1,pcVar3);
  return (void *)0x0;
}

Assistant:

static void* authentication_clone_option(const char* name, const void* value)
{
    void* result;

    if (name == NULL)
    {
        LogError("Failed to clone authentication option (name is NULL)");
        result = NULL;
    }
    else if (value == NULL)
    {
        LogError("Failed to clone authentication option (value is NULL)");
        result = NULL;
    }
    else
    {
        if (strcmp(AUTHENTICATION_OPTION_CBS_REQUEST_TIMEOUT_SECS, name) == 0 ||
            strcmp(AUTHENTICATION_OPTION_SAVED_OPTIONS, name) == 0)
        {
            result = (void*)value;
        }
        else
        {
            LogError("Failed to clone authentication option (option with name '%s' is not suppported)", name);
            result = NULL;
        }
    }

    return result;
}